

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowAggregatorLocalState::Finalize
          (WindowAggregatorLocalState *this,WindowAggregatorGlobalState *gastate,
          CollectionPtr collection)

{
  bool bVar1;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *in_RDI;
  WindowCollection *in_stack_00000028;
  optional_ptr<duckdb::WindowCollection,_true> *in_stack_ffffffffffffffe0;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *
                     )0x1a30ba5);
  if (!bVar1) {
    optional_ptr<duckdb::WindowCollection,_true>::operator*(in_stack_ffffffffffffffe0);
    make_uniq<duckdb::WindowCursor,duckdb::WindowCollection&,duckdb::vector<unsigned_long,true>const&>
              (in_stack_00000028,(vector<unsigned_long,_true> *)collection.ptr);
    unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator=
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               in_stack_ffffffffffffffe0,in_RDI);
    unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::~unique_ptr
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               0x1a30bec);
  }
  return;
}

Assistant:

void WindowAggregatorLocalState::Finalize(WindowAggregatorGlobalState &gastate, CollectionPtr collection) {
	// Prepare to scan
	if (!cursor) {
		cursor = make_uniq<WindowCursor>(*collection, gastate.aggregator.child_idx);
	}
}